

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armutils.h
# Opt level: O1

bool asmjit::v1_14::arm::Utils::encodeLogicalImm(uint64_t imm,uint32_t width,LogicalImm *out)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  do {
    uVar4 = width >> 1;
    uVar3 = width & 0xfffffffe;
    if (((imm >> ((byte)uVar4 & 0x3f) ^ imm) & ~(-1L << ((byte)uVar4 & 0x3f))) != 0) break;
    width = uVar4;
    uVar3 = uVar4;
  } while (2 < uVar4);
  uVar5 = 0;
  if (uVar3 != 0) {
    uVar5 = 0xffffffffffffffff >> (-(char)uVar3 & 0x3fU);
  }
  uVar6 = imm & uVar5;
  if (uVar6 != uVar5 && uVar6 != 0) {
    lVar1 = 0;
    if ((uVar6 ^ 0xffffffffffffffff) != 0) {
      for (; ((uVar6 ^ 0xffffffffffffffff) >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    uVar6 = -1L << ((byte)lVar1 & 0x3f) ^ uVar6;
    lVar2 = 0;
    if ((uVar6 ^ 0xffffffffffffffff) != 0) {
      for (; ((uVar6 ^ 0xffffffffffffffff) >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar4 = (uint)lVar2;
    if (uVar6 == 0xffffffffffffffff) {
      uVar4 = uVar3;
    }
    uVar5 = 0xffffffffffffffff >> (-(char)uVar4 & 0x3fU);
    if (uVar4 == 0) {
      uVar5 = 0;
    }
    uVar8 = uVar5 ^ uVar6;
    lVar2 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar7 = (uint)lVar2;
    if (uVar5 == uVar6) {
      uVar7 = uVar3;
    }
    uVar5 = 0xffffffffffffffff >> (-(char)uVar7 & 0x3fU);
    if (uVar7 == 0) {
      uVar5 = 0;
    }
    if ((uVar5 ^ uVar8) == 0xffffffffffffffff) {
      if ((lVar1 != 0) && (uVar3 != uVar7)) {
        return false;
      }
      out->n = (uint)(uVar3 == 0x40);
      out->s = uVar3 * -2 & 0x3e | ~uVar4 + (int)lVar1 + uVar7;
      out->r = uVar3 - uVar4;
      return true;
    }
  }
  return false;
}

Assistant:

ASMJIT_MAYBE_UNUSED
static bool encodeLogicalImm(uint64_t imm, uint32_t width, LogicalImm* out) noexcept {
  // Determine the element width, which must be 2, 4, 8, 16, 32, or 64 bits.
  do {
    width /= 2;
    uint64_t mask = (uint64_t(1) << width) - 1u;
    if ((imm & mask) != ((imm >> width) & mask)) {
      width *= 2;
      break;
    }
  } while (width > 2);

  // Patterns of all zeros and all ones are not encodable.
  uint64_t lsbMask = Support::lsbMask<uint64_t>(width);
  imm &= lsbMask;

  if (imm == 0 || imm == lsbMask)
    return false;

  // Inspect the pattern and get the most important bit indexes.
  //
  //         oIndex <-+      +-> zIndex
  //                  |      |
  // |..zeros..|oCount|zCount|..ones..|
  // |000000000|111111|000000|11111111|

  uint32_t zIndex = Support::ctz(~imm);
  uint64_t zImm = imm ^ ((uint64_t(1) << zIndex) - 1);
  uint32_t zCount = (zImm ? Support::ctz(zImm) : width) - zIndex;

  uint32_t oIndex = zIndex + zCount;
  uint64_t oImm = ~(zImm ^ Support::lsbMask<uint64_t>(oIndex));
  uint32_t oCount = (oImm ? Support::ctz(oImm) : width) - (oIndex);

  // Verify whether the bit-pattern is encodable.
  uint64_t mustBeZero = oImm ^ ~Support::lsbMask<uint64_t>(oIndex + oCount);
  if (mustBeZero != 0 || (zIndex > 0 && width - (oIndex + oCount) != 0))
    return false;

  out->n = width == 64;
  out->s = (oCount + zIndex - 1) | (Support::neg(width * 2) & 0x3F);
  out->r = width - oIndex;
  return true;
}